

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_24_3_1824b316 comp,int bad_allowed,bool leftmost)

{
  anon_class_24_3_1824b316 comp_00;
  anon_class_24_3_1824b316 comp_01;
  anon_class_24_3_1824b316 __comp;
  anon_class_24_3_1824b316 __comp_00;
  anon_class_24_3_1824b316 comp_02;
  anon_class_24_3_1824b316 comp_03;
  anon_class_24_3_1824b316 comp_04;
  anon_class_24_3_1824b316 comp_05;
  anon_class_24_3_1824b316 comp_06;
  anon_class_24_3_1824b316 comp_07;
  anon_class_24_3_1824b316 comp_08;
  anon_class_24_3_1824b316 comp_09;
  anon_class_24_3_1824b316 comp_10;
  bool bVar1;
  difference_type dVar2;
  difference_type dVar3;
  difference_type dVar4;
  undefined1 in_CL;
  int in_EDX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RSI;
  HighsInt *in_RDI;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar5;
  anon_class_24_3_1824b316 in_stack_00000000;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_00000018;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffbb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffbc0;
  HighsInt *pHVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffbc8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var8;
  bool local_429;
  byte local_411;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffbf8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffc38;
  HighsInt *in_stack_fffffffffffffc40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_180;
  HighsNodeQueue *local_178;
  HighsInt *local_170;
  int *local_160;
  HighsInt *local_158;
  int *local_150;
  int *local_148;
  HighsInt *local_140;
  HighsNodeQueue *local_138;
  HighsInt *local_130;
  int *local_120;
  int *local_118;
  int *local_110;
  HighsNodeQueue *local_108;
  HighsInt *local_100;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  HighsNodeQueue *local_d8;
  HighsInt *local_d0;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  HighsNodeQueue *local_a8;
  HighsInt *local_a0;
  int *local_90;
  int *local_88;
  HighsInt *local_80;
  long local_78;
  HighsNodeQueue *local_70;
  HighsInt *local_68;
  HighsInt *local_50;
  HighsNodeQueue *local_48;
  HighsInt *local_40;
  HighsInt *local_28;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_8;
  
  uVar9 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  local_8._M_current = in_RDI;
  do {
    while( true ) {
      dVar2 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffbc0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffbb8._M_current);
      if (dVar2 < 0x18) {
        local_70 = in_stack_00000000.nodequeue;
        local_68 = in_stack_00000000.r;
        if ((uVar9 & 0x1000000) == 0) {
          local_50 = local_8._M_current;
          comp_01.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc18._M_current;
          comp_01.this = (HighsCutGeneration *)in_stack_fffffffffffffc10._M_current;
          comp_01.r = in_stack_fffffffffffffc20._M_current;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,comp_01);
        }
        else {
          local_28 = local_8._M_current;
          comp_00.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc18._M_current;
          comp_00.this = (HighsCutGeneration *)in_stack_fffffffffffffc10._M_current;
          comp_00.r = in_stack_fffffffffffffc20._M_current;
          local_48 = local_70;
          local_40 = local_68;
          insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,comp_00);
        }
        return;
      }
      local_78 = dVar2 / 2;
      if (dVar2 < 0x81) {
        local_150 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0._M_current)
        ;
        local_158 = local_8._M_current;
        local_160 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator-(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0._M_current)
        ;
        local_178 = in_stack_00000000.nodequeue;
        _Var7._M_current = in_stack_00000000.r;
        comp_10.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc78._M_current;
        comp_10.this = (HighsCutGeneration *)in_stack_fffffffffffffc70._M_current;
        comp_10.r = in_stack_fffffffffffffc80._M_current;
        p_Var8 = in_stack_00000018;
        local_170 = _Var7._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   comp_10);
      }
      else {
        local_80 = local_8._M_current;
        local_88 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0._M_current);
        local_90 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0._M_current);
        local_a8 = in_stack_00000000.nodequeue;
        pHVar6 = in_stack_00000000.r;
        comp_06.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc78._M_current;
        comp_06.this = (HighsCutGeneration *)in_stack_fffffffffffffc70._M_current;
        comp_06.r = in_stack_fffffffffffffc80._M_current;
        p_Var8 = in_stack_00000018;
        local_a0 = pHVar6;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   comp_06);
        local_b0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(p_Var8,(difference_type)pHVar6);
        local_b8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(p_Var8,(difference_type)pHVar6);
        local_c0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(p_Var8,(difference_type)pHVar6);
        local_d8 = in_stack_00000000.nodequeue;
        pHVar6 = in_stack_00000000.r;
        comp_07.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc78._M_current;
        comp_07.this = (HighsCutGeneration *)in_stack_fffffffffffffc70._M_current;
        comp_07.r = in_stack_fffffffffffffc80._M_current;
        p_Var8 = in_stack_00000018;
        local_d0 = pHVar6;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   comp_07);
        local_e0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(p_Var8,(difference_type)pHVar6);
        local_e8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(p_Var8,(difference_type)pHVar6);
        local_f0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(p_Var8,(difference_type)pHVar6);
        local_108 = in_stack_00000000.nodequeue;
        pHVar6 = in_stack_00000000.r;
        comp_08.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc78._M_current;
        comp_08.this = (HighsCutGeneration *)in_stack_fffffffffffffc70._M_current;
        comp_08.r = in_stack_fffffffffffffc80._M_current;
        p_Var8 = in_stack_00000018;
        local_100 = pHVar6;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   comp_08);
        local_110 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(p_Var8,(difference_type)pHVar6);
        local_118 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(p_Var8,(difference_type)pHVar6);
        local_120 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(p_Var8,(difference_type)pHVar6);
        __b._M_current = (int *)in_stack_00000000.nodequeue;
        _Var7._M_current = in_stack_00000000.r;
        comp_09.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc78._M_current;
        comp_09.this = (HighsCutGeneration *)in_stack_fffffffffffffc70._M_current;
        comp_09.r = in_stack_fffffffffffffc80._M_current;
        p_Var8 = in_stack_00000018;
        local_138 = (HighsNodeQueue *)__b._M_current;
        local_130 = _Var7._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   comp_09);
        local_140 = local_8._M_current;
        local_148 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(p_Var8,_Var7._M_current);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (_Var7,__b);
      }
      local_411 = 0;
      if ((uVar9 & 0x1000000) == 0) {
        local_180 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator-(p_Var8,_Var7._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_180);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_8);
        bVar1 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          ((anon_class_24_3_1824b316 *)in_stack_fffffffffffffc08._M_current,
                           (HighsInt)((ulong)in_stack_fffffffffffffc00._M_current >> 0x20),
                           (HighsInt)in_stack_fffffffffffffc00._M_current);
        local_411 = bVar1 ^ 0xff;
      }
      in_stack_fffffffffffffbb8._M_current = (int *)in_stack_00000000.nodequeue;
      in_stack_fffffffffffffbc0._M_current = in_stack_00000000.r;
      if ((local_411 & 1) == 0) break;
      comp_04.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc38;
      comp_04.this = (HighsCutGeneration *)in_stack_fffffffffffffc30._M_current;
      comp_04.r = in_stack_fffffffffffffc40;
      in_stack_fffffffffffffbc8 = in_stack_00000018;
      partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,comp_04);
      local_8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0._M_current);
    }
    comp_05.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc58._M_current;
    comp_05.this = (HighsCutGeneration *)in_stack_fffffffffffffc50._M_current;
    comp_05.r = in_stack_fffffffffffffc60._M_current;
    p_Var8 = in_stack_00000018;
    pVar5 = partition_right<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                      (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,comp_05);
    in_stack_fffffffffffffc18 = pVar5.first._M_current;
    dVar3 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffbc0._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffbb8._M_current);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
    dVar4 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffbc0._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffbb8._M_current);
    if (dVar3 < dVar2 / 8 || dVar4 < dVar2 / 8) {
      in_EDX = in_EDX + -1;
      if (in_EDX == 0) {
        __comp.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc28._M_current;
        __comp.this = (HighsCutGeneration *)in_stack_fffffffffffffc20._M_current;
        __comp.r = in_stack_fffffffffffffc30._M_current;
        std::
        make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,__comp);
        __comp_00.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc28._M_current;
        __comp_00.this = (HighsCutGeneration *)in_stack_fffffffffffffc20._M_current;
        __comp_00.r = in_stack_fffffffffffffc30._M_current;
        std::
        sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                  (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,__comp_00);
        return;
      }
      if (0x17 < dVar3) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        if (0x80 < dVar3) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        }
      }
      if (0x17 < dVar4) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        if (0x80 < dVar4) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (p_Var8,(difference_type)in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          in_stack_fffffffffffffc80 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(p_Var8,in_stack_fffffffffffffbc0._M_current);
          in_stack_fffffffffffffc78 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(p_Var8,in_stack_fffffffffffffbc0._M_current);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        }
      }
    }
    else {
      local_429 = false;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        in_stack_fffffffffffffc50._M_current = (int *)in_stack_00000000.nodequeue;
        pHVar6 = in_stack_00000000.r;
        comp_02.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc28._M_current;
        comp_02.this = (HighsCutGeneration *)in_stack_fffffffffffffc20._M_current;
        comp_02.r = in_stack_fffffffffffffc30._M_current;
        p_Var8 = in_stack_00000018;
        in_stack_fffffffffffffc58._M_current = pHVar6;
        in_stack_fffffffffffffc60._M_current = (int *)in_stack_00000018;
        in_stack_fffffffffffffc70._M_current = local_8._M_current;
        bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                          (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,comp_02);
        local_429 = false;
        if (bVar1) {
          in_stack_fffffffffffffc40 = in_RSI._M_current;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (p_Var8,(difference_type)pHVar6);
          in_stack_fffffffffffffc28._M_current = (int *)in_stack_00000000.nodequeue;
          in_stack_fffffffffffffc30._M_current = in_stack_00000000.r;
          comp_03.nodequeue = (HighsNodeQueue *)in_stack_fffffffffffffc28._M_current;
          comp_03.this = (HighsCutGeneration *)in_stack_fffffffffffffc20._M_current;
          comp_03.r = in_stack_fffffffffffffc30._M_current;
          in_stack_fffffffffffffc38 = in_stack_00000018;
          in_RSI._M_current = in_stack_fffffffffffffc40;
          local_429 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                                (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,comp_03);
        }
      }
      if (local_429 != false) {
        return;
      }
    }
    in_stack_fffffffffffffbb8._M_current = (int *)in_stack_00000000.nodequeue;
    in_stack_fffffffffffffbc0._M_current = in_stack_00000000.r;
    _Var7._M_current._4_4_ = in_EDX;
    _Var7._M_current._0_4_ = uVar9;
    in_stack_fffffffffffffbc8 = in_stack_00000018;
    in_stack_fffffffffffffc00._M_current = in_stack_fffffffffffffbb8._M_current;
    in_stack_fffffffffffffc08._M_current = in_stack_fffffffffffffbc0._M_current;
    in_stack_fffffffffffffc10._M_current = (int *)in_stack_00000018;
    in_stack_fffffffffffffc20._M_current = local_8._M_current;
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
              (in_RSI,_Var7,in_stack_00000000,(int)((ulong)dVar2 >> 0x20),
               SUB81((ulong)dVar2 >> 0x18,0));
    in_stack_fffffffffffffbf8 =
         __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                   (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0._M_current);
    uVar9 = uVar9 & 0xffffff;
    local_8 = in_stack_fffffffffffffbf8;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }